

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

NULLCArray NULLC::StrConcatenate(NULLCArray a,NULLCArray b)

{
  NULLCArray NVar1;
  uint size;
  char *__dest;
  uint uVar2;
  uint uVar3;
  bool local_61;
  int shift;
  NULLCArray b_local;
  NULLCArray a_local;
  NULLCArray ret;
  
  uVar3 = a.len;
  uVar2 = b.len;
  local_61 = false;
  if (uVar3 != 0) {
    local_61 = a.ptr[uVar3 - 1] == '\0';
  }
  size = (uVar3 + uVar2) - (uint)local_61;
  __dest = (char *)AllocObject(size,2);
  if (__dest != (char *)0x0) {
    if (uVar3 != 0) {
      memcpy(__dest,a.ptr,(ulong)uVar3);
    }
    if (uVar2 != 0) {
      memcpy(__dest + ((ulong)uVar3 - (long)(int)(uint)local_61),b.ptr,(ulong)uVar2);
    }
  }
  NVar1.len = size;
  NVar1.ptr = __dest;
  return NVar1;
}

Assistant:

NULLCArray NULLC::StrConcatenate(NULLCArray a, NULLCArray b)
{
	NULLCArray ret;

	// If first part is zero-terminated, override zero in the new string
	int shift = a.len && (a.ptr[a.len-1] == 0);
	ret.len = a.len + b.len - shift;
	ret.ptr = (char*)AllocObject(ret.len, NULLC_TYPE_CHAR);
	if(!ret.ptr)
		return ret;

	if(a.len)
		memcpy(ret.ptr, a.ptr, a.len);

	if(b.len)
		memcpy(ret.ptr + a.len - shift, b.ptr, b.len);

	return ret;
}